

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_3,_0>
       ::run(CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
             *mat,scalar_sum_op<double> *func)

{
  long lVar1;
  PointerType pdVar2;
  Index index;
  long lVar3;
  long lVar4;
  long lVar5;
  Scalar SVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Packet2d mask;
  
  lVar1 = (mat->m_xpr).
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_0>
          .m_rows.m_value;
  if (lVar1 != 0) {
    lVar3 = 4;
    pdVar2 = (mat->m_xpr).
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_0>
             .m_data;
    if (lVar1 + 1U < 3) {
      SVar6 = ABS(*pdVar2);
      for (lVar3 = 1; lVar3 < lVar1; lVar3 = lVar3 + 1) {
        SVar6 = SVar6 + ABS(pdVar2[lVar3]);
      }
    }
    else {
      lVar4 = (lVar1 / 2) * 2;
      dVar9 = ABS(*pdVar2);
      dVar10 = ABS(pdVar2[1]);
      if (3 < lVar1) {
        lVar5 = (lVar1 / 4) * 4;
        dVar7 = ABS(pdVar2[2]);
        dVar8 = ABS(pdVar2[3]);
        for (; lVar3 < lVar5; lVar3 = lVar3 + 4) {
          dVar9 = dVar9 + ABS(pdVar2[lVar3]);
          dVar10 = dVar10 + ABS((pdVar2 + lVar3)[1]);
          dVar7 = dVar7 + ABS(pdVar2[lVar3 + 2]);
          dVar8 = dVar8 + ABS((pdVar2 + lVar3 + 2)[1]);
        }
        dVar9 = dVar9 + dVar7;
        dVar10 = dVar10 + dVar8;
        if (lVar5 < lVar4) {
          dVar9 = dVar9 + ABS(pdVar2[(lVar1 / 4) * 4]);
          dVar10 = dVar10 + ABS((pdVar2 + (lVar1 / 4) * 4)[1]);
        }
      }
      SVar6 = dVar10 + dVar9;
      for (; lVar4 < lVar1; lVar4 = lVar4 + 1) {
        SVar6 = SVar6 + ABS(pdVar2[lVar4]);
      }
    }
    return SVar6;
  }
  __assert_fail("size && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Redux.h"
                ,0xca,
                "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<double>, Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>>, Traversal = 3, Unrolling = 0]"
               );
}

Assistant:

static Scalar run(const Derived& mat, const Func& func)
  {
    const Index size = mat.size();
    eigen_assert(size && "you are using an empty matrix");
    const Index packetSize = packet_traits<Scalar>::size;
    const Index alignedStart = internal::first_aligned(mat);
    enum {
      alignment = bool(Derived::Flags & DirectAccessBit) || bool(Derived::Flags & AlignedBit)
                ? Aligned : Unaligned
    };
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = mat.template packet<alignment>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = mat.template packet<alignment>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment>(index));
          packet_res1 = func.packetOp(packet_res1, mat.template packet<alignment>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,mat.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,mat.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = mat.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,mat.coeff(index));
    }

    return res;
  }